

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdcolor.c
# Opt level: O1

void null_convert(j_compress_ptr cinfo,JSAMPARRAY input_buf,JSAMPIMAGE output_buf,
                 JDIMENSION output_row,int num_rows)

{
  int iVar1;
  uint uVar2;
  JSAMPROW pJVar3;
  bool bVar4;
  JSAMPLE *pJVar5;
  long lVar6;
  ulong uVar7;
  
  if (0 < num_rows) {
    iVar1 = cinfo->num_components;
    uVar2 = cinfo->image_width;
    do {
      if (0 < iVar1) {
        lVar6 = 0;
        do {
          if ((ulong)uVar2 != 0) {
            pJVar3 = output_buf[lVar6][output_row];
            pJVar5 = *input_buf + lVar6;
            uVar7 = 0;
            do {
              pJVar3[uVar7] = *pJVar5;
              uVar7 = uVar7 + 1;
              pJVar5 = pJVar5 + iVar1;
            } while (uVar2 != uVar7);
          }
          lVar6 = lVar6 + 1;
        } while (lVar6 != iVar1);
      }
      input_buf = input_buf + 1;
      output_row = output_row + 1;
      bVar4 = 1 < num_rows;
      num_rows = num_rows + -1;
    } while (bVar4);
  }
  return;
}

Assistant:

METHODDEF(void)
null_convert (j_decompress_ptr cinfo,
	      JSAMPIMAGE input_buf, JDIMENSION input_row,
	      JSAMPARRAY output_buf, int num_rows)
{
  register JSAMPROW inptr, outptr;
  register JDIMENSION count;
  register int num_components = cinfo->num_components;
  JDIMENSION num_cols = cinfo->output_width;
  int ci;

  while (--num_rows >= 0) {
    for (ci = 0; ci < num_components; ci++) {
      inptr = input_buf[ci][input_row];
      outptr = output_buf[0] + ci;
      for (count = num_cols; count > 0; count--) {
	*outptr = *inptr++;	/* needn't bother with GETJSAMPLE() here */
	outptr += num_components;
      }
    }
    input_row++;
    output_buf++;
  }
}